

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathUtil.cpp
# Opt level: O1

string * opencollada::Path::RemoveDotSegments(string *__return_storage_ptr__,string *path)

{
  pointer pcVar1;
  size_type __n;
  bool bVar2;
  int iVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  char *pcVar6;
  string input;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  pcVar1 = (path->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + path->_M_string_length);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  do {
    while( true ) {
      while( true ) {
        while( true ) {
          if (local_78._M_string_length == 0) {
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p);
            }
            return __return_storage_ptr__;
          }
          bVar2 = String::StartsWith(&local_78,(string *)dot_dot_slash_abi_cxx11_);
          if ((!bVar2) &&
             (bVar2 = String::StartsWith(&local_78,(string *)dot_slash_abi_cxx11_), !bVar2)) break;
          ::std::__cxx11::string::erase((ulong)&local_78,0);
        }
        bVar2 = String::StartsWith(&local_78,(string *)slash_dot_slash_abi_cxx11_);
        pcVar6 = slash_dot_slash_len;
        if ((!bVar2) &&
           ((bVar2 = String::StartsWith(&local_78,(string *)slash_dot_abi_cxx11_), !bVar2 ||
            ((pcVar6 = slash_dot_len, local_78._M_dataplus._M_p[(long)slash_dot_len] != '\0' &&
             (local_78._M_dataplus._M_p[(long)slash_dot_len] != '/')))))) break;
        ::std::__cxx11::string::replace((ulong)&local_78,0,pcVar6,0x14730c);
      }
      bVar2 = String::StartsWith(&local_78,(string *)slash_dot_dot_slash_abi_cxx11_);
      if (!bVar2) break;
      ::std::__cxx11::string::replace((ulong)&local_78,0,slash_dot_dot_slash_len,0x14730c);
LAB_00123489:
      sVar4 = ::std::__cxx11::string::rfind((char)__return_storage_ptr__,0x2f);
      if (sVar4 == 0xffffffffffffffff) {
        __return_storage_ptr__->_M_string_length = 0;
        _Var5._M_p = (pointer)(__return_storage_ptr__->_M_dataplus)._M_p;
      }
      else {
        pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
        __return_storage_ptr__->_M_string_length = sVar4;
        _Var5._M_p = (pointer)(pcVar1 + sVar4);
      }
LAB_00123599:
      *_Var5._M_p = '\0';
    }
    bVar2 = String::StartsWith(&local_78,(string *)slash_dot_dot_abi_cxx11_);
    __n = local_78._M_string_length;
    if ((bVar2) &&
       ((local_78._M_dataplus._M_p[(long)slash_dot_dot_len] == '/' ||
        (local_78._M_dataplus._M_p[(long)slash_dot_dot_len] == '\0')))) {
      ::std::__cxx11::string::replace((ulong)&local_78,0,slash_dot_dot_len,0x14730c);
      goto LAB_00123489;
    }
    if (((local_78._M_string_length == DAT_0015c970) &&
        ((local_78._M_string_length == 0 ||
         (iVar3 = bcmp(local_78._M_dataplus._M_p,dot_abi_cxx11_,local_78._M_string_length),
         iVar3 == 0)))) ||
       ((__n == DAT_0015c990 &&
        ((__n == 0 || (iVar3 = bcmp(local_78._M_dataplus._M_p,dot_dot_abi_cxx11_,__n), iVar3 == 0)))
        ))) {
      local_78._M_string_length = 0;
      _Var5._M_p = local_78._M_dataplus._M_p;
      goto LAB_00123599;
    }
    ::std::__cxx11::string::find((char)&local_78,0x2f);
    ::std::__cxx11::string::find((char)&local_78,0x2f);
    ::std::__cxx11::string::substr((ulong)local_50,(ulong)&local_78);
    ::std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    ::std::__cxx11::string::erase((ulong)&local_78,0);
  } while( true );
}

Assistant:

string Path::RemoveDotSegments(const string & path)
	{
		string input = path;
		string output;
		output.reserve(input.length());

#if defined(_WIN32)
		bool contains_anti_slash = String::Replace(input, '\\', '/') > 0;
#endif

		while (!input.empty())
		{
			if (String::StartsWith(input, dot_dot_slash))
			{
				input.erase(0, dot_dot_slash_len);
			}
			else if (String::StartsWith(input, dot_slash))
			{
				input.erase(0, dot_slash_len);
			}
			else if (String::StartsWith(input, slash_dot_slash))
			{
				input.replace(0, slash_dot_slash_len, "/");
			}
			else if (String::StartsWith(input, slash_dot) &&
				(input[slash_dot_len] == '/' || input[slash_dot_len] == '\0'))
			{
				input.replace(0, slash_dot_len, "/");
			}
			else if (String::StartsWith(input, slash_dot_dot_slash))
			{
				input.replace(0, slash_dot_dot_slash_len, "/");
				size_t slash_pos = output.rfind('/');
				if (slash_pos == string::npos)
					output.clear();
				else
					output.erase(output.begin() + static_cast<ptrdiff_t>(slash_pos), output.end());
			}
			else if (String::StartsWith(input, slash_dot_dot) &&
				(input[slash_dot_dot_len] == '/' || input[slash_dot_dot_len] == '\0'))
			{
				input.replace(0, slash_dot_dot_len, "/");
				size_t slash_pos = output.rfind('/');
				if (slash_pos == string::npos)
					output.clear();
				else
					output.erase(output.begin() + static_cast<ptrdiff_t>(slash_pos), output.end());
			}
			else if (input == dot || input == dot_dot)
			{
				input.clear();
			}
			else
			{
				size_t begin = input.find('/');
				if (begin == 0)
					begin = 0;
				size_t end = input.find('/', 1);
				output.append(input.substr(0, end));
				input.erase(0, end);
			}
		}

#if defined(_WIN32)
		if (contains_anti_slash)
			String::Replace(output, '/', '\\');
#endif

		return output;
	}